

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

void libxml_xmlParserCtxtErrorHandler(void *ctx,xmlError *error)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  PyObject *pPVar4;
  long *plVar5;
  int val;
  
  puVar2 = *(undefined8 **)((long)ctx + 0x1a8);
  if ((error->domain == 0x17) || (error->domain == 4)) {
    val = (error->level != XML_ERR_WARNING) + 1;
  }
  else {
    val = (error->level != XML_ERR_WARNING) + 3;
  }
  plVar3 = (long *)PyTuple_New(4);
  PyTuple_SetItem(plVar3,0,puVar2[1]);
  plVar5 = (long *)puVar2[1];
  if (plVar5 != (long *)0x0) {
    *plVar5 = *plVar5 + 1;
  }
  pPVar4 = libxml_constcharPtrWrap(error->message);
  PyTuple_SetItem(plVar3,1,pPVar4);
  pPVar4 = libxml_intWrap(val);
  PyTuple_SetItem(plVar3,2,pPVar4);
  PyTuple_SetItem(plVar3,3,&_Py_NoneStruct);
  __Py_NoneStruct = __Py_NoneStruct + 1;
  plVar5 = (long *)PyObject_CallObject(*puVar2,plVar3);
  if (plVar5 == (long *)0x0) {
    PyErr_Print();
    if (plVar3 == (long *)0x0) {
      return;
    }
    *plVar3 = *plVar3 + -1;
    lVar1 = *plVar3;
    plVar5 = plVar3;
  }
  else {
    if ((plVar3 != (long *)0x0) && (*plVar3 = *plVar3 + -1, *plVar3 == 0)) {
      _Py_Dealloc(plVar3);
    }
    *plVar5 = *plVar5 + -1;
    lVar1 = *plVar5;
  }
  if (lVar1 != 0) {
    return;
  }
  _Py_Dealloc(plVar5);
  return;
}

Assistant:

static void
libxml_xmlParserCtxtErrorHandler(void *ctx, const xmlError *error)
{
    PyObject *list;
    PyObject *result;
    xmlParserCtxtPtr ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;
    int severity;
    
    ctxt = (xmlParserCtxtPtr)ctx;
    pyCtxt = (xmlParserCtxtPyCtxtPtr)ctxt->_private;

    if ((error->domain == XML_FROM_VALID) ||
        (error->domain == XML_FROM_DTD)) {
        if (error->level == XML_ERR_WARNING)
            severity = XML_PARSER_SEVERITY_VALIDITY_WARNING;
        else
            severity = XML_PARSER_SEVERITY_VALIDITY_ERROR;
    } else {
        if (error->level == XML_ERR_WARNING)
            severity = XML_PARSER_SEVERITY_WARNING;
        else
            severity = XML_PARSER_SEVERITY_ERROR;
    }

    list = PyTuple_New(4);
    PyTuple_SetItem(list, 0, pyCtxt->arg);
    Py_XINCREF(pyCtxt->arg);
    PyTuple_SetItem(list, 1, libxml_constcharPtrWrap(error->message));
    PyTuple_SetItem(list, 2, libxml_intWrap(severity));
    PyTuple_SetItem(list, 3, Py_None);
    Py_INCREF(Py_None);
    result = PyObject_CallObject(pyCtxt->f, list);
    if (result == NULL) 
    {
	/* TODO: manage for the exception to be propagated... */
	PyErr_Print();
    }
    Py_XDECREF(list);
    Py_XDECREF(result);
}